

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall
test_flash_attn_ext::build_graph(test_flash_attn_ext *this,ggml_context *ctx)

{
  ggml_type gVar1;
  int i;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ggml_tensor *pgVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int64_t ne_perm [4];
  int64_t ne [4];
  ulong local_88 [4];
  ulong local_68 [7];
  
  lVar7 = this->hsk;
  lVar2 = ggml_blck_size(this->type_KV);
  lVar3 = ggml_blck_size(this->type_KV);
  uVar11 = -lVar3 & (lVar7 + lVar2) - 1U;
  lVar7 = this->hsv;
  lVar2 = ggml_blck_size(this->type_KV);
  lVar3 = ggml_blck_size(this->type_KV);
  local_68[0] = uVar11;
  local_68[1] = this->nb;
  local_68[2] = this->nr * this->nh;
  local_68[3] = 1;
  lVar4 = 0;
  do {
    local_88[(this->permute)._M_elems[lVar4]] = local_68[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  uVar5 = ggml_new_tensor_4d(ctx,0,local_88[0],local_88[1],local_88[2],local_88[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  local_68[4] = 0x100000000;
  local_68[5] = 0x300000002;
  auVar12[0] = -((char)(this->permute)._M_elems[0] == '\0');
  auVar12[1] = -(*(char *)((long)(this->permute)._M_elems + 1) == '\0');
  auVar12[2] = -(*(char *)((long)(this->permute)._M_elems + 2) == '\0');
  auVar12[3] = -(*(char *)((long)(this->permute)._M_elems + 3) == '\0');
  auVar12[4] = -((char)(this->permute)._M_elems[1] == '\x01');
  auVar12[5] = -(*(char *)((long)(this->permute)._M_elems + 5) == '\0');
  auVar12[6] = -(*(char *)((long)(this->permute)._M_elems + 6) == '\0');
  auVar12[7] = -(*(char *)((long)(this->permute)._M_elems + 7) == '\0');
  auVar12[8] = -((char)(this->permute)._M_elems[2] == '\x02');
  auVar12[9] = -(*(char *)((long)(this->permute)._M_elems + 9) == '\0');
  auVar12[10] = -(*(char *)((long)(this->permute)._M_elems + 10) == '\0');
  auVar12[0xb] = -(*(char *)((long)(this->permute)._M_elems + 0xb) == '\0');
  auVar12[0xc] = -((char)(this->permute)._M_elems[3] == '\x03');
  auVar12[0xd] = -(*(char *)((long)(this->permute)._M_elems + 0xd) == '\0');
  auVar12[0xe] = -(*(char *)((long)(this->permute)._M_elems + 0xe) == '\0');
  auVar12[0xf] = -(*(char *)((long)(this->permute)._M_elems + 0xf) == '\0');
  if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf)
      != 0xffff) {
    uVar5 = ggml_permute(ctx,uVar5,(this->permute)._M_elems[0],(this->permute)._M_elems[1],
                         (this->permute)._M_elems[2],(this->permute)._M_elems[3]);
  }
  ggml_set_name(uVar5,"q");
  gVar1 = this->type_KV;
  local_68[0] = uVar11;
  local_68[1] = this->kv;
  local_68[2] = this->nh;
  local_68[3] = 1;
  lVar4 = 0;
  do {
    local_88[(this->permute)._M_elems[lVar4]] = local_68[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  uVar6 = ggml_new_tensor_4d(ctx,gVar1,local_88[0],local_88[1],local_88[2],local_88[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  local_68[4] = 0x100000000;
  local_68[5] = 0x300000002;
  auVar13[0] = -((char)(this->permute)._M_elems[0] == '\0');
  auVar13[1] = -(*(char *)((long)(this->permute)._M_elems + 1) == '\0');
  auVar13[2] = -(*(char *)((long)(this->permute)._M_elems + 2) == '\0');
  auVar13[3] = -(*(char *)((long)(this->permute)._M_elems + 3) == '\0');
  auVar13[4] = -((char)(this->permute)._M_elems[1] == '\x01');
  auVar13[5] = -(*(char *)((long)(this->permute)._M_elems + 5) == '\0');
  auVar13[6] = -(*(char *)((long)(this->permute)._M_elems + 6) == '\0');
  auVar13[7] = -(*(char *)((long)(this->permute)._M_elems + 7) == '\0');
  auVar13[8] = -((char)(this->permute)._M_elems[2] == '\x02');
  auVar13[9] = -(*(char *)((long)(this->permute)._M_elems + 9) == '\0');
  auVar13[10] = -(*(char *)((long)(this->permute)._M_elems + 10) == '\0');
  auVar13[0xb] = -(*(char *)((long)(this->permute)._M_elems + 0xb) == '\0');
  auVar13[0xc] = -((char)(this->permute)._M_elems[3] == '\x03');
  auVar13[0xd] = -(*(char *)((long)(this->permute)._M_elems + 0xd) == '\0');
  auVar13[0xe] = -(*(char *)((long)(this->permute)._M_elems + 0xe) == '\0');
  auVar13[0xf] = -(*(char *)((long)(this->permute)._M_elems + 0xf) == '\0');
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      != 0xffff) {
    uVar6 = ggml_permute(ctx,uVar6,(this->permute)._M_elems[0],(this->permute)._M_elems[1],
                         (this->permute)._M_elems[2],(this->permute)._M_elems[3]);
  }
  ggml_set_name(uVar6,"k");
  gVar1 = this->type_KV;
  local_68[0] = lVar7 + -1 + lVar2 & -lVar3;
  local_68[1] = this->kv;
  local_68[2] = this->nh;
  local_68[3] = 1;
  lVar7 = 0;
  do {
    local_88[(this->permute)._M_elems[lVar7]] = local_68[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  uVar8 = ggml_new_tensor_4d(ctx,gVar1,local_88[0],local_88[1],local_88[2],local_88[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  local_68[4] = 0x100000000;
  local_68[5] = 0x300000002;
  auVar14[0] = -((char)(this->permute)._M_elems[0] == '\0');
  auVar14[1] = -(*(char *)((long)(this->permute)._M_elems + 1) == '\0');
  auVar14[2] = -(*(char *)((long)(this->permute)._M_elems + 2) == '\0');
  auVar14[3] = -(*(char *)((long)(this->permute)._M_elems + 3) == '\0');
  auVar14[4] = -((char)(this->permute)._M_elems[1] == '\x01');
  auVar14[5] = -(*(char *)((long)(this->permute)._M_elems + 5) == '\0');
  auVar14[6] = -(*(char *)((long)(this->permute)._M_elems + 6) == '\0');
  auVar14[7] = -(*(char *)((long)(this->permute)._M_elems + 7) == '\0');
  auVar14[8] = -((char)(this->permute)._M_elems[2] == '\x02');
  auVar14[9] = -(*(char *)((long)(this->permute)._M_elems + 9) == '\0');
  auVar14[10] = -(*(char *)((long)(this->permute)._M_elems + 10) == '\0');
  auVar14[0xb] = -(*(char *)((long)(this->permute)._M_elems + 0xb) == '\0');
  auVar14[0xc] = -((char)(this->permute)._M_elems[3] == '\x03');
  auVar14[0xd] = -(*(char *)((long)(this->permute)._M_elems + 0xd) == '\0');
  auVar14[0xe] = -(*(char *)((long)(this->permute)._M_elems + 0xe) == '\0');
  auVar14[0xf] = -(*(char *)((long)(this->permute)._M_elems + 0xf) == '\0');
  if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf)
      != 0xffff) {
    uVar8 = ggml_permute(ctx,uVar8,(this->permute)._M_elems[0],(this->permute)._M_elems[1],
                         (this->permute)._M_elems[2],(this->permute)._M_elems[3]);
  }
  ggml_set_name(uVar8,"v");
  if (this->mask == true) {
    uVar9 = ggml_new_tensor_4d(ctx,1,this->kv,this->nb + 0x3fU & 0xffffffffffffffc0,1,1);
    test_case::add_sentinel(&this->super_test_case,ctx);
    ggml_set_name(uVar9,"m");
  }
  else {
    uVar9 = 0;
  }
  if ((float)this->hsk < 0.0) {
    sqrtf((float)this->hsk);
  }
  pgVar10 = (ggml_tensor *)ggml_flash_attn_ext(ctx,uVar5,uVar6,uVar8,uVar9);
  ggml_flash_attn_ext_set_prec(pgVar10,this->prec);
  ggml_set_name(pgVar10,"out");
  return pgVar10;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        const int64_t hsk_padded = GGML_PAD(hsk, ggml_blck_size(type_KV));
        const int64_t hsv_padded = GGML_PAD(hsv, ggml_blck_size(type_KV));

        auto const &create_permuted = [&](ggml_type type, int64_t ne0, int64_t ne1, int64_t ne2, int64_t ne3) -> ggml_tensor * {
            int64_t ne[4] = {ne0, ne1, ne2, ne3};
            int64_t ne_perm[4];
            for (int i = 0; i < 4; ++i) {
                ne_perm[permute[i]] = ne[i];
            }
            ggml_tensor * t = ggml_new_tensor_4d(ctx, type, ne_perm[0], ne_perm[1], ne_perm[2], ne_perm[3]);
            if (permute != std::array<int32_t, 4>{0, 1, 2, 3}) {
                t = ggml_permute(ctx, t, permute[0], permute[1], permute[2], permute[3]);
            }
            return t;
        };

        ggml_tensor * q = create_permuted(GGML_TYPE_F32, hsk_padded, nb, nh*nr, 1);
        ggml_set_name(q, "q");

        ggml_tensor * k = create_permuted(type_KV,       hsk_padded, kv, nh,    1);
        ggml_set_name(k, "k");

        ggml_tensor * v = create_permuted(type_KV,       hsv_padded, kv, nh,    1);
        ggml_set_name(v, "v");

        ggml_tensor * m = nullptr;
        if (mask) {
            m = ggml_new_tensor_4d(ctx, GGML_TYPE_F16, kv, GGML_PAD(nb, GGML_KQ_MASK_PAD), 1, 1);
            ggml_set_name(m, "m");
        }

        ggml_tensor * out = ggml_flash_attn_ext(ctx, q, k, v, m, 1.0f/sqrtf(hsk), max_bias, logit_softcap);
        ggml_flash_attn_ext_set_prec(out, prec);
        ggml_set_name(out, "out");

        return out;
    }